

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmJoin<std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
                   (string *__return_storage_ptr__,
                   vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *rng,
                   string_view separator)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  *__lhs;
  basic_ostream<char,_std::char_traits<char>_> *os_00;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_1b0;
  const_iterator end;
  const_iterator it;
  ostringstream os;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *rng_local;
  string_view separator_local;
  
  bVar1 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::empty(rng);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&it);
    end = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(rng);
    local_1b0._M_current =
         (cmLinkImplItem *)std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(rng);
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
             ::operator*(&end);
    operator<<((ostream *)&it,&pcVar2->super_cmLinkItem);
    while( true ) {
      __lhs = __gnu_cxx::
              __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
              ::operator++(&end);
      bVar1 = __gnu_cxx::operator!=(__lhs,&local_1b0);
      if (!bVar1) break;
      os_00 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&it,separator);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
               ::operator*(&end);
      operator<<(os_00,&pcVar2->super_cmLinkItem);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&it);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& rng, cm::string_view separator)
{
  if (rng.empty()) {
    return std::string();
  }

  std::ostringstream os;
  auto it = rng.begin();
  auto const end = rng.end();
  os << *it;
  while (++it != end) {
    os << separator << *it;
  }
  return os.str();
}